

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O1

SUNErrCode SUNAdaptController_Write_Soderlind(SUNAdaptController C,FILE *fptr)

{
  fwrite("Soderlind SUNAdaptController module:\n",0x25,1,(FILE *)fptr);
  fprintf((FILE *)fptr,"  k1 = %.15g\n",*C->content);
  fprintf((FILE *)fptr,"  k2 = %.15g\n",*(undefined8 *)((long)C->content + 8));
  fprintf((FILE *)fptr,"  k3 = %.15g\n",*(undefined8 *)((long)C->content + 0x10));
  fprintf((FILE *)fptr,"  k4 = %.15g\n",*(undefined8 *)((long)C->content + 0x18));
  fprintf((FILE *)fptr,"  k5 = %.15g\n",*(undefined8 *)((long)C->content + 0x20));
  fprintf((FILE *)fptr,"  bias factor = %.15g\n",*(undefined8 *)((long)C->content + 0x28));
  fprintf((FILE *)fptr,"  previous error = %.15g\n",*(undefined8 *)((long)C->content + 0x30));
  fprintf((FILE *)fptr,"  previous-previous error = %.15g\n",
          *(undefined8 *)((long)C->content + 0x38));
  fprintf((FILE *)fptr,"  previous step = %.15g\n",*(undefined8 *)((long)C->content + 0x40));
  fprintf((FILE *)fptr,"  previous-previous step = %.15g\n",*(undefined8 *)((long)C->content + 0x48)
         );
  fprintf((FILE *)fptr,"  firststeps = %i\n",(ulong)*(uint *)((long)C->content + 0x50));
  fprintf((FILE *)fptr,"  historysize = %i\n",(ulong)*(uint *)((long)C->content + 0x54));
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_Write_Soderlind(SUNAdaptController C, FILE* fptr)
{
  SUNFunctionBegin(C->sunctx);
  SUNAssert(fptr, SUN_ERR_ARG_CORRUPT);
  fprintf(fptr, "Soderlind SUNAdaptController module:\n");
  fprintf(fptr, "  k1 = " SUN_FORMAT_G "\n", SODERLIND_K1(C));
  fprintf(fptr, "  k2 = " SUN_FORMAT_G "\n", SODERLIND_K2(C));
  fprintf(fptr, "  k3 = " SUN_FORMAT_G "\n", SODERLIND_K3(C));
  fprintf(fptr, "  k4 = " SUN_FORMAT_G "\n", SODERLIND_K4(C));
  fprintf(fptr, "  k5 = " SUN_FORMAT_G "\n", SODERLIND_K5(C));
  fprintf(fptr, "  bias factor = " SUN_FORMAT_G "\n", SODERLIND_BIAS(C));
  fprintf(fptr, "  previous error = " SUN_FORMAT_G "\n", SODERLIND_EP(C));
  fprintf(fptr, "  previous-previous error = " SUN_FORMAT_G "\n",
          SODERLIND_EPP(C));
  fprintf(fptr, "  previous step = " SUN_FORMAT_G "\n", SODERLIND_HP(C));
  fprintf(fptr, "  previous-previous step = " SUN_FORMAT_G "\n",
          SODERLIND_HPP(C));
  fprintf(fptr, "  firststeps = %i\n", SODERLIND_FIRSTSTEPS(C));
  fprintf(fptr, "  historysize = %i\n", SODERLIND_HISTORYSIZE(C));
  return SUN_SUCCESS;
}